

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_xxmrghw(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 dst;
  TCGv_i64 dst_00;
  TCGv_i64 dst_01;
  TCGv_i64 dst_02;
  TCGv_i64 ret;
  uintptr_t o_2;
  uintptr_t o_3;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_4;
  
  if (ctx->vsx_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    dst = tcg_temp_new_i64(tcg_ctx);
    dst_00 = tcg_temp_new_i64(tcg_ctx);
    dst_01 = tcg_temp_new_i64(tcg_ctx);
    dst_02 = tcg_temp_new_i64(tcg_ctx);
    ret = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx,dst,(ctx->opcode >> 0x10 & 0x1f) + (ctx->opcode & 4) * 8);
    get_cpu_vsrh(tcg_ctx,dst_00,(ctx->opcode >> 0x10 & 0x1f) + (ctx->opcode & 4) * 8);
    get_cpu_vsrh(tcg_ctx,dst_01,ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4);
    get_cpu_vsrh(tcg_ctx,dst_02,ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4);
    tcg_gen_shri_i64_ppc64(tcg_ctx,dst,dst,0x20);
    tcg_gen_shri_i64_ppc64(tcg_ctx,dst_01,dst_01,0x20);
    tcg_gen_deposit_i64_ppc64(tcg_ctx,ret,dst_01,dst,0x20,0x20);
    set_cpu_vsrh(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5,ret);
    tcg_gen_deposit_i64_ppc64(tcg_ctx,ret,dst_02,dst_00,0x20,0x20);
    set_cpu_vsrl(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5,ret);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst_00 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst_01 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst_02 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xxsel(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rt = xT(ctx->opcode);
    int ra = xA(ctx->opcode);
    int rb = xB(ctx->opcode);
    int rc = xC(ctx->opcode);

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    tcg_gen_gvec_bitsel(tcg_ctx, MO_64, vsr_full_offset(rt), vsr_full_offset(rc),
                        vsr_full_offset(rb), vsr_full_offset(ra), 16, 16);
}